

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O0

void shtest(void)

{
  int local_130 [2];
  int f;
  int i;
  double x [32];
  double *season;
  double crit;
  int Nseas;
  int differencing_term;
  int N;
  
  memcpy(&f,&DAT_0017f880,0x100);
  local_130[0] = 2;
  x[0x1f] = (double)malloc(8);
  SHtest((double *)&f,0x20,local_130,1,(double *)x[0x1f]);
  printf("stat %g Differencing Term %d \n",*(undefined8 *)x[0x1f],(ulong)(0.64 < *(double *)x[0x1f])
        );
  free((void *)x[0x1f]);
  return;
}

Assistant:

void shtest() {
	int N = 32;
	int differencing_term,Nseas;
	double crit;
	double *season;
	double x[32] = {-50, 175, 149, 214, 247, 237, 225, 329, 729, 809,
       530, 489, 540, 457, 195, 176, 337, 239, 128, 102, 232, 429, 3,
       98, 43, -141, -77, -13, 125, 361, -45, 184};
	
	int i;
	int f = 2;
	
	Nseas = 1;
	crit = 0.64;

	season = (double*) malloc(sizeof(double)*Nseas);

	SHtest(x,N,&f,Nseas,season);

	differencing_term = *season > crit ? 1 : 0;

	printf("stat %g Differencing Term %d \n",*season,differencing_term);

	free(season);
}